

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O0

RK_S32 mpp_trie_walk(MppTrieNode *node,RK_U64 *tag_val,RK_S32 *tag_len,RK_U32 key)

{
  int iVar1;
  RK_U64 RVar2;
  RK_S32 len;
  RK_U64 val;
  RK_U32 key_local;
  RK_S32 *tag_len_local;
  RK_U64 *tag_val_local;
  MppTrieNode *node_local;
  
  RVar2 = *tag_val;
  iVar1 = *tag_len;
  if (iVar1 < node->tag_len) {
    *tag_val = RVar2 << 4 | (ulong)key;
    *tag_len = iVar1 + 1;
    if ((mpp_trie_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_trie",
                 "node %d:%d tag len %d - %d val %016llx - %016llx -> key %x -> tag fill\n",
                 "mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,
                 (int)node->tag_len,*tag_len,node->tag_val,*tag_val,key);
    }
    node_local._4_4_ = (int)node->idx;
  }
  else if (node->tag_len == 0) {
    if ((mpp_trie_debug & 0x10) != 0) {
      _mpp_log_l(4,"mpp_trie","node %d:%d -> key %x -> next %d\n","mpp_trie_walk",
                 (ulong)(uint)(int)node->idx,(ulong)(uint)node->id,key,(int)node->next[key]);
    }
    node_local._4_4_ = (int)node->next[key];
  }
  else {
    *tag_val = 0;
    *tag_len = 0;
    if (node->tag_val == RVar2) {
      if ((mpp_trie_debug & 0x10) != 0) {
        _mpp_log_l(4,"mpp_trie",
                   "node %d:%d tag len %d - %d val %016llx - %016llx -> tag match -> key %d next %d\n"
                   ,"mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,
                   (int)node->tag_len,iVar1,node->tag_val,RVar2,key,(int)node->next[key]);
      }
      node_local._4_4_ = (int)node->next[key];
    }
    else {
      if ((mpp_trie_debug & 0x10) != 0) {
        _mpp_log_l(4,"mpp_trie","node %d:%d tag len %d - %d val %016llx - %016llx -> tag mismatch\n"
                   ,"mpp_trie_walk",(ulong)(uint)(int)node->idx,(ulong)(uint)node->id,
                   (int)node->tag_len,iVar1,node->tag_val,RVar2);
      }
      node_local._4_4_ = -1;
    }
  }
  return node_local._4_4_;
}

Assistant:

static RK_S32 mpp_trie_walk(MppTrieNode *node, RK_U64 *tag_val, RK_S32 *tag_len, RK_U32 key)
{
    RK_U64 val = *tag_val;
    RK_S32 len = *tag_len;

    if (node->tag_len > len) {
        *tag_val = (val << 4) | key;
        *tag_len = len + 1;

        trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> key %x -> tag fill\n",
                      node->idx, node->id, node->tag_len, *tag_len, node->tag_val, *tag_val, key);

        return node->idx;
    }

    /* normal next switch node */
    if (!node->tag_len) {
        trie_dbg_walk("node %d:%d -> key %x -> next %d\n",
                      node->idx, node->id, key, node->next[key]);

        return node->next[key];
    }

    *tag_val = 0;
    *tag_len = 0;

    if (node->tag_val != val) {
        trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> tag mismatch\n",
                      node->idx, node->id, node->tag_len, len, node->tag_val, val);
        return INVALID_NODE_ID;
    }

    trie_dbg_walk("node %d:%d tag len %d - %d val %016llx - %016llx -> tag match -> key %d next %d\n",
                  node->idx, node->id, node->tag_len, len, node->tag_val, val, key, node->next[key]);

    return node->next[key];
}